

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.h
# Opt level: O3

Vec3f TRM::barycentric<2ul>
                (vec<2,_float,_(glm::qualifier)0> A,vec<2,_float,_(glm::qualifier)0> B,
                vec<2,_float,_(glm::qualifier)0> C,vec<2,_float,_(glm::qualifier)0> P)

{
  bool bVar1;
  bool bVar2;
  Vec3f *pVVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar8;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar9;
  Vec3f VVar10;
  Vec3f VVar11;
  Vec3f s [2];
  
  bVar4 = false;
  pVVar3 = s;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    aVar8.x = A.field_1;
    aVar9.x = C.field_1;
    if (!bVar4) {
      aVar8 = A.field_0;
      aVar9 = C.field_0;
    }
    (pVVar3->field_0).x = aVar9.x - aVar8.x;
    aVar9.x = B.field_1;
    if (!bVar4) {
      aVar9 = B.field_0;
    }
    (pVVar3->field_1).y = aVar9.x - aVar8.x;
    aVar9.x = P.field_1;
    if (!bVar4) {
      aVar9 = P.field_0;
    }
    (pVVar3->field_2).z = aVar8.x - aVar9.x;
    bVar4 = true;
    pVVar3 = s + 1;
    bVar1 = false;
  } while (bVar2);
  fVar7 = s[0].field_0.x * s[1].field_1.y - s[0].field_1.y * s[1].field_0.x;
  if (0.01 < ABS(fVar7)) {
    fVar5 = s[0].field_1.y * s[1].field_2.z - s[0].field_2.z * s[1].field_1.y;
    fVar6 = s[1].field_0.x * s[0].field_2.z - s[0].field_0.x * s[1].field_2.z;
    VVar10.field_0 = 1.0 - (fVar5 + fVar6) / fVar7;
    VVar10.field_1.y = fVar6 / fVar7;
    VVar10.field_2.z = fVar5 / fVar7;
    return VVar10;
  }
  VVar11.field_2.z = 1.0;
  VVar11.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0xbf800000;
  VVar11.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f800000;
  return VVar11;
}

Assistant:

Vec3f barycentric(glm::vec<DimRows, float, glm::defaultp> A,
                  glm::vec<DimRows, float, glm::defaultp> B,
                  glm::vec<DimRows, float, glm::defaultp> C,
                  glm::vec<DimRows, float, glm::defaultp> P) {
  if (DimRows < 2) {
    return Vec3f(1., 1., 1.);
  } else {
    Vec3f s[2];
    for (int i = 0; i < 2; i++) {
      s[i][0] = C[i] - A[i];
      s[i][1] = B[i] - A[i];
      s[i][2] = A[i] - P[i];
    }
    Vec3f u = cross(s[0], s[1]);
    if (std::abs(u[2]) > 1e-2)  // dont forget that u[2] is integer. If it is
                                // zero then triangle ABC is degenerate
      return Vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
    return Vec3f(-1, 1, 1);  // in this case generate negative coordinates, it
                             // will be thrown away by the rasterizator
  }
}